

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall clask::server_t::parse_tree(server_t *this,node *n,string *s,func_t *fn)

{
  char cVar1;
  node *pnVar2;
  pointer p_Var3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  _node *vv;
  pointer p_Var7;
  node *n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sub;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_t local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  node *local_110;
  func_t *local_108;
  server_t *local_100;
  undefined1 local_f8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Any_data local_c0;
  _Manager_type local_b0;
  _Invoker_type p_Stack_a8;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type p_Stack_88;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  bool local_60;
  string local_50;
  
  local_100 = this;
  lVar6 = std::__cxx11::string::find((char)s,0x2f);
  cVar1 = (s->_M_dataplus)._M_p[1];
  if (lVar6 == -1) {
    std::__cxx11::string::substr((ulong)&local_130,(ulong)s);
    sVar4 = local_128;
    paVar8 = local_130;
    p_Var3 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (p_Var7 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                  _M_impl.super__Vector_impl_data._M_start; p_Var7 != p_Var3; p_Var7 = p_Var7 + 1) {
      if (((p_Var7->name)._M_string_length == sVar4) &&
         ((sVar4 == 0 || (iVar5 = bcmp((p_Var7->name)._M_dataplus._M_p,paVar8,sVar4), iVar5 == 0))))
      goto LAB_0011cc73;
    }
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    local_130 = &local_120;
    local_f8._24_8_ = &local_d0;
    if (paVar8 != local_130) {
      local_f8._24_8_ = paVar8;
    }
    local_d0._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_d0._M_local_buf[0] = local_120._M_local_buf[0];
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    std::function<void_(clask::response_writer_&,_clask::request_&)>::function
              ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_c0,
               &fn->f_writer);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                *)&local_a0,&fn->f_string);
    std::function<clask::response_(clask::request_&)>::function
              ((function<clask::response_(clask::request_&)> *)&local_80,&fn->f_response);
    local_60 = cVar1 == ':';
    std::vector<clask::_node,std::allocator<clask::_node>>::emplace_back<clask::_node&>
              ((vector<clask::_node,std::allocator<clask::_node>> *)n,(_node *)local_f8);
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    if (local_b0 != (_Manager_type)0x0) {
      (*local_b0)(&local_c0,&local_c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._24_8_ != &local_d0) {
      operator_delete((void *)local_f8._24_8_,local_d0._M_allocated_capacity + 1);
    }
    std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
              ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_f8);
    paVar8 = local_130;
LAB_0011cc73:
    if (paVar8 == &local_120) {
      return;
    }
    lVar6 = CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
  }
  else {
    local_108 = fn;
    std::__cxx11::string::substr((ulong)&local_130,(ulong)s);
    if (cVar1 == ':') {
      std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_130);
      std::__cxx11::string::operator=((string *)&local_130,(string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
    sVar4 = local_128;
    paVar8 = local_130;
    pnVar2 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (n_00 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>.
                _M_impl.super__Vector_impl_data._M_start; local_110 = n, n_00 != pnVar2;
        n_00 = n_00 + 1) {
      if (((n_00->name)._M_string_length == sVar4) &&
         ((sVar4 == 0 || (iVar5 = bcmp((n_00->name)._M_dataplus._M_p,paVar8,sVar4), iVar5 == 0)))) {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)s);
        parse_tree(local_100,n_00,(string *)local_f8,local_108);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        goto LAB_0011cb68;
      }
      n = local_110;
    }
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    local_130 = &local_120;
    local_f8._24_8_ = &local_d0;
    if (paVar8 != local_130) {
      local_f8._24_8_ = paVar8;
    }
    local_d0._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_d0._M_local_buf[0] = local_120._M_local_buf[0];
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_c0._M_unused._M_object = (void *)0x0;
    local_c0._8_8_ = 0;
    local_b0 = (_Manager_type)0x0;
    p_Stack_a8 = (_Invoker_type)0x0;
    local_a0._M_unused._M_object = (void *)0x0;
    local_a0._8_8_ = 0;
    local_90 = (_Manager_type)0x0;
    p_Stack_88 = (_Invoker_type)0x0;
    local_80._M_unused._M_object = (void *)0x0;
    local_80._8_8_ = 0;
    local_70 = (_Manager_type)0x0;
    p_Stack_68 = (_Invoker_type)0x0;
    local_60 = cVar1 == ':';
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    parse_tree(local_100,(node *)local_f8,&local_50,local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::vector<clask::_node,_std::allocator<clask::_node>_>::emplace_back<clask::_node>
              (&n->children,(_node *)local_f8);
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_90 != (_Manager_type)0x0) {
      (*local_90)(&local_a0,&local_a0,__destroy_functor);
    }
    if (local_b0 != (_Manager_type)0x0) {
      (*local_b0)(&local_c0,&local_c0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._24_8_ != &local_d0) {
      operator_delete((void *)local_f8._24_8_,local_d0._M_allocated_capacity + 1);
    }
    std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
              ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_f8);
LAB_0011cb68:
    if (local_130 == &local_120) {
      return;
    }
    lVar6 = CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
    paVar8 = local_130;
  }
  operator_delete(paVar8,lVar6 + 1);
  return;
}

Assistant:

inline void server_t::parse_tree(node& n, const std::string& s, const func_t& fn) {
  auto pos = s.find('/', 1);
  auto placeholder = s[1] == ':';
  if (pos == std::string::npos) {
    bool found = false;
    auto sub = s.substr(placeholder ? 2 : 1);
    for (auto& vv : n.children) {
      if (vv.name == sub) {
        found = true;
        break;
      }
    }
    if (!found) {
      node nn =  {
        .name = std::move(sub),
        .fn = fn,
        .placeholder = placeholder,
      };
      n.children.emplace_back(nn);
    }
    return;
  }
  auto sub = s.substr(1, pos - 1);
  if (placeholder) sub = sub.substr(1);
  bool found = false;
  for (auto& vv : n.children) {
    if (vv.name == sub) {
      found = true;
      parse_tree(vv, s.substr(pos), fn);
      break;
    }
  }
  if (!found) {
    node nn = {
      .name = std::move(sub),
      .placeholder = placeholder,
    };
    parse_tree(nn, s.substr(pos), fn);
    n.children.emplace_back(std::move(nn));
  }
}